

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

quaternion * quaternion_set_from_axis_anglev3(quaternion *self,vector3 *axis,double angle)

{
  double dVar1;
  double dVar2;
  double dVar3;
  quaternion *pqVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = (axis->field_0).v[0];
  dVar2 = (axis->field_0).v[1];
  dVar3 = (axis->field_0).v[2];
  dVar5 = sin(angle * 0.5);
  dVar6 = cos(angle * 0.5);
  (self->field_0).q[0] = dVar1 * dVar5;
  (self->field_0).q[1] = dVar2 * dVar5;
  (self->field_0).q[2] = dVar3 * dVar5;
  (self->field_0).q[3] = dVar6;
  pqVar4 = quaternion_normalize(self);
  return pqVar4;
}

Assistant:

HYPAPI struct quaternion *quaternion_set_from_axis_anglev3(struct quaternion *self, const struct vector3 *axis, HYP_FLOAT angle)
{
	return quaternion_set_from_axis_anglef3(self, axis->x, axis->y, axis->z, angle);
}